

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode cf_setup_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uint uVar1;
  undefined8 uVar2;
  Curl_cfilter *pCVar3;
  curl_trc_feat *pcVar4;
  _Bool _Var5;
  CURLcode CVar6;
  long lVar7;
  uint *puVar8;
  undefined7 in_register_00000011;
  Curl_cfilter *pCVar9;
  connectdata *pcVar10;
  ulong uVar11;
  Curl_cfilter *local_50;
  uint local_44;
  _Bool *local_40;
  uint *local_38;
  
  if ((cf->field_0x24 & 1) == 0) {
    uVar11 = CONCAT71(in_register_00000011,blocking) & 0xffffffff;
    local_38 = (uint *)cf->ctx;
    pCVar9 = cf->next;
    puVar8 = local_38;
LAB_0011bf18:
    if ((pCVar9 != (Curl_cfilter *)0x0) && ((pCVar9->field_0x24 & 1) == 0)) {
      CVar6 = Curl_conn_cf_connect(pCVar9,data,SUB81(uVar11,0),done);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if (*done != true) {
        return CURLE_OK;
      }
    }
    uVar1 = *puVar8;
    if (uVar1 == 1) {
LAB_0011c053:
      if (((ulong)cf->conn->bits & 2) != 0) {
        CVar6 = Curl_cf_socks_proxy_insert_after(cf,data);
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
        *puVar8 = 2;
        pCVar3 = cf->next;
        pCVar9 = (Curl_cfilter *)0x0;
        if ((pCVar3 == (Curl_cfilter *)0x0) || (pCVar9 = pCVar3, (pCVar3->field_0x24 & 1) == 0))
        goto LAB_0011bf18;
      }
LAB_0011c09a:
      pcVar10 = cf->conn;
      if (((ulong)pcVar10->bits & 1) != 0) {
        if (((((pcVar10->http_proxy).proxytype & 0xfe) == 2) &&
            (_Var5 = Curl_conn_is_ssl(pcVar10,cf->sockindex), !_Var5)) &&
           (CVar6 = Curl_cf_ssl_proxy_insert_after(cf,data), CVar6 != CURLE_OK)) {
          return CVar6;
        }
        if ((((ulong)cf->conn->bits & 8) != 0) &&
           (CVar6 = Curl_cf_http_proxy_insert_after(cf,data), CVar6 != CURLE_OK)) {
          return CVar6;
        }
        *puVar8 = 3;
        pCVar3 = cf->next;
        pCVar9 = (Curl_cfilter *)0x0;
        if ((pCVar3 == (Curl_cfilter *)0x0) || (pCVar9 = pCVar3, (pCVar3->field_0x24 & 1) == 0))
        goto LAB_0011bf18;
      }
LAB_0011c11a:
      if (((data->set).field_0x8cf & 0x20) != 0) {
        _Var5 = Curl_conn_is_ssl(cf->conn,cf->sockindex);
        if (_Var5) {
          Curl_failf(data,"haproxy protocol not support with SSL encryption in place (QUIC?)");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        CVar6 = Curl_cf_haproxy_insert_after(cf,data);
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
      }
      *puVar8 = 4;
      pCVar3 = cf->next;
      pCVar9 = (Curl_cfilter *)0x0;
      if ((pCVar3 == (Curl_cfilter *)0x0) || (pCVar9 = pCVar3, (pCVar3->field_0x24 & 1) == 0))
      goto LAB_0011bf18;
    }
    else {
      if (uVar1 == 0) {
        uVar2 = *(undefined8 *)(puVar8 + 2);
        uVar1 = puVar8[5];
        lVar7 = 8;
        while (*(uint *)((long)&__do_global_dtors_aux_fini_array_entry + lVar7) != uVar1) {
          lVar7 = lVar7 + 0x10;
          if (lVar7 == 0x38) goto LAB_0011c1f4;
        }
        lVar7 = *(long *)((long)&transport_providers[0].transport + lVar7);
        if (lVar7 == 0) {
LAB_0011c1f4:
          if (data == (Curl_easy *)0x0) {
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          if (((data->set).field_0x8cd & 0x10) == 0) {
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          pcVar4 = (data->state).feat;
          if (pcVar4 == (curl_trc_feat *)0x0) {
            if (cf == (Curl_cfilter *)0x0) {
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
          }
          else {
            if (cf == (Curl_cfilter *)0x0) {
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
            if (pcVar4->log_level < 1) {
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
          }
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"unsupported transport type %d",(ulong)uVar1);
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        local_44 = (uint)uVar11;
        local_50 = (Curl_cfilter *)0x0;
        local_40 = done;
        puVar8 = (uint *)(*Curl_ccalloc)(1,0x48);
        if (puVar8 == (uint *)0x0) {
          CVar6 = CURLE_OUT_OF_MEMORY;
          pCVar9 = (Curl_cfilter *)0x0;
LAB_0011c27b:
          (*Curl_cfree)(pCVar9);
          local_50 = (Curl_cfilter *)0x0;
          (*Curl_cfree)(puVar8);
          return CVar6;
        }
        *puVar8 = uVar1;
        *(long *)(puVar8 + 2) = lVar7;
        *(undefined8 *)(puVar8 + 4) = uVar2;
        CVar6 = Curl_cf_create(&local_50,&Curl_cft_happy_eyeballs,puVar8);
        pCVar9 = local_50;
        if (CVar6 != CURLE_OK) goto LAB_0011c27b;
        Curl_conn_cf_insert_after(cf,local_50);
        *local_38 = 1;
        pCVar3 = cf->next;
        uVar11 = (ulong)local_44;
        done = local_40;
        pCVar9 = (Curl_cfilter *)0x0;
        puVar8 = local_38;
        if ((pCVar3 != (Curl_cfilter *)0x0) && (pCVar9 = pCVar3, (pCVar3->field_0x24 & 1) != 0))
        goto LAB_0011c053;
        goto LAB_0011bf18;
      }
      if (uVar1 < 3) goto LAB_0011c09a;
      if (uVar1 == 3) goto LAB_0011c11a;
      if (4 < uVar1) goto LAB_0011c1dc;
    }
    if (puVar8[4] != 0) {
      if (puVar8[4] == 1) {
        pcVar10 = cf->conn;
      }
      else {
        pcVar10 = cf->conn;
        if ((pcVar10->handler->flags & 1) == 0) goto LAB_0011c1b5;
      }
      _Var5 = Curl_conn_is_ssl(pcVar10,cf->sockindex);
      if ((!_Var5) && (CVar6 = Curl_cf_ssl_insert_after(cf,data), CVar6 != CURLE_OK)) {
        return CVar6;
      }
    }
LAB_0011c1b5:
    *puVar8 = 5;
    pCVar3 = cf->next;
    pCVar9 = (Curl_cfilter *)0x0;
    if ((pCVar3 == (Curl_cfilter *)0x0) || (pCVar9 = pCVar3, (pCVar3->field_0x24 & 1) == 0))
    goto LAB_0011bf18;
LAB_0011c1dc:
    *puVar8 = 6;
    cf->field_0x24 = cf->field_0x24 | 1;
  }
  *done = true;
  return CURLE_OK;
}

Assistant:

static CURLcode cf_setup_connect(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 bool blocking, bool *done)
{
  struct cf_setup_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* connect current sub-chain */
connect_sub_chain:
  if(cf->next && !cf->next->connected) {
    result = Curl_conn_cf_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  if(ctx->state < CF_SETUP_CNNCT_EYEBALLS) {
    result = cf_he_insert_after(cf, data, ctx->remotehost, ctx->transport);
    if(result)
      return result;
    ctx->state = CF_SETUP_CNNCT_EYEBALLS;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  /* sub-chain connected, do we need to add more? */
#ifndef CURL_DISABLE_PROXY
  if(ctx->state < CF_SETUP_CNNCT_SOCKS && cf->conn->bits.socksproxy) {
    result = Curl_cf_socks_proxy_insert_after(cf, data);
    if(result)
      return result;
    ctx->state = CF_SETUP_CNNCT_SOCKS;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  if(ctx->state < CF_SETUP_CNNCT_HTTP_PROXY && cf->conn->bits.httpproxy) {
#ifdef USE_SSL
    if(IS_HTTPS_PROXY(cf->conn->http_proxy.proxytype)
       && !Curl_conn_is_ssl(cf->conn, cf->sockindex)) {
      result = Curl_cf_ssl_proxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* USE_SSL */

#if !defined(CURL_DISABLE_HTTP)
    if(cf->conn->bits.tunnel_proxy) {
      result = Curl_cf_http_proxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* !CURL_DISABLE_HTTP */
    ctx->state = CF_SETUP_CNNCT_HTTP_PROXY;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }
#endif /* !CURL_DISABLE_PROXY */

  if(ctx->state < CF_SETUP_CNNCT_HAPROXY) {
#if !defined(CURL_DISABLE_PROXY)
    if(data->set.haproxyprotocol) {
      if(Curl_conn_is_ssl(cf->conn, cf->sockindex)) {
        failf(data, "haproxy protocol not support with SSL "
              "encryption in place (QUIC?)");
        return CURLE_UNSUPPORTED_PROTOCOL;
      }
      result = Curl_cf_haproxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* !CURL_DISABLE_PROXY */
    ctx->state = CF_SETUP_CNNCT_HAPROXY;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  if(ctx->state < CF_SETUP_CNNCT_SSL) {
#ifdef USE_SSL
    if((ctx->ssl_mode == CURL_CF_SSL_ENABLE
        || (ctx->ssl_mode != CURL_CF_SSL_DISABLE
           && cf->conn->handler->flags & PROTOPT_SSL)) /* we want SSL */
       && !Curl_conn_is_ssl(cf->conn, cf->sockindex)) { /* it is missing */
      result = Curl_cf_ssl_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* USE_SSL */
    ctx->state = CF_SETUP_CNNCT_SSL;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  ctx->state = CF_SETUP_DONE;
  cf->connected = TRUE;
  *done = TRUE;
  return CURLE_OK;
}